

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

FMStructDescList FMcopy_struct_list(FMStructDescList list)

{
  FMStructDescList p_Var1;
  char *pcVar2;
  FMFieldList p_Var3;
  long in_RDI;
  int format;
  FMStructDescList new_list;
  int format_count;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  undefined4 in_stack_fffffffffffffff0;
  int iVar5;
  
  iVar5 = 0;
  while (*(long *)(in_RDI + (long)iVar5 * 0x20) != 0) {
    iVar5 = iVar5 + 1;
  }
  p_Var1 = (FMStructDescList)
           ffs_malloc(CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
    pcVar2 = strdup(*(char **)(in_RDI + (long)iVar4 * 0x20));
    p_Var1[iVar4].format_name = pcVar2;
    p_Var3 = copy_field_list((FMFieldList)CONCAT44(iVar5,in_stack_fffffffffffffff0));
    p_Var1[iVar4].field_list = p_Var3;
    p_Var1[iVar4].struct_size = *(int *)(in_RDI + (long)iVar4 * 0x20 + 0x10);
    p_Var1[iVar4].opt_info = *(FMOptInfo **)(in_RDI + (long)iVar4 * 0x20 + 0x18);
  }
  p_Var1[iVar5].format_name = (char *)0x0;
  p_Var1[iVar5].field_list = (FMFieldList)0x0;
  p_Var1[iVar5].struct_size = 0;
  p_Var1[iVar5].opt_info = (FMOptInfo *)0x0;
  return p_Var1;
}

Assistant:

extern
FMStructDescList
FMcopy_struct_list(FMStructDescList list)
{
    int format_count = 0;
    FMStructDescList new_list;
    int format;

    while(list[format_count].format_name != NULL) format_count++;

    new_list = (FMStructDescList) malloc((size_t) sizeof(FMStructDescRec) *
					     (format_count + 1));
    for (format = 0; format < format_count; format++) {
	new_list[format].format_name = strdup(list[format].format_name);
	new_list[format].field_list = copy_field_list(list[format].field_list);
	new_list[format].struct_size = list[format].struct_size;
	new_list[format].opt_info = list[format].opt_info;
    }
    new_list[format_count].format_name = NULL;
    new_list[format_count].field_list = NULL;
    new_list[format_count].struct_size = 0;
    new_list[format_count].opt_info = NULL;
    return new_list;
}